

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall wabt::interp::Table::Grow(Table *this,Store *store,u32 count,Ref ref)

{
  pointer pRVar1;
  pointer pRVar2;
  ulong uVar3;
  u32 offset;
  bool bVar4;
  Enum EVar5;
  ulong uVar6;
  
  pRVar1 = (this->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pRVar2 = (this->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar4 = Store::HasValueType(store,ref,
                              (ValueType)*(Enum *)&(this->type_).super_ExternType.field_0xc);
  EVar5 = Error;
  if (((bVar4) && (uVar3 = (this->type_).limits.max, count <= uVar3)) &&
     (uVar6 = (ulong)((long)pRVar1 - (long)pRVar2) >> 3, (uVar6 & 0xffffffff) <= uVar3 - count)) {
    offset = (u32)uVar6;
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
              (&this->elements_,(ulong)(offset + count));
    Fill(this,store,offset,ref,count);
    EVar5 = Ok;
  }
  return (Result)EVar5;
}

Assistant:

Result Table::Grow(Store& store, u32 count, Ref ref) {
  size_t old_size = elements_.size();
  u32 new_size;
  if (store.HasValueType(ref, type_.element) &&
      CanGrow(type_.limits, old_size, count, &new_size)) {
    elements_.resize(new_size);
    Fill(store, old_size, ref, new_size - old_size);
    return Result::Ok;
  }
  return Result::Error;
}